

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPool.c
# Opt level: O0

void Acec_ManCollectBoxSets_rec
               (Gia_Man_t *p,int Carry,int iRank,Vec_Int_t *vAdds,Vec_Int_t *vCarryMap,
               Vec_Int_t *vBoxes,Vec_Int_t *vBoxRanks)

{
  int Entry;
  int iVar1;
  int iBox;
  Vec_Int_t *vBoxes_local;
  Vec_Int_t *vCarryMap_local;
  Vec_Int_t *vAdds_local;
  int iRank_local;
  int Carry_local;
  Gia_Man_t *p_local;
  
  Entry = Vec_IntEntry(vCarryMap,Carry);
  if (Entry != -1) {
    iVar1 = Vec_IntEntry(vAdds,Entry * 6);
    Acec_ManCollectBoxSets_rec(p,iVar1,iRank + 1,vAdds,vCarryMap,vBoxes,vBoxRanks);
    iVar1 = Vec_IntEntry(vAdds,Entry * 6 + 1);
    Acec_ManCollectBoxSets_rec(p,iVar1,iRank + 1,vAdds,vCarryMap,vBoxes,vBoxRanks);
    iVar1 = Vec_IntEntry(vAdds,Entry * 6 + 2);
    if (iVar1 != 0) {
      iVar1 = Vec_IntEntry(vAdds,Entry * 6 + 2);
      Acec_ManCollectBoxSets_rec(p,iVar1,iRank + 1,vAdds,vCarryMap,vBoxes,vBoxRanks);
    }
    Vec_IntPush(vBoxes,Entry);
    Vec_IntWriteEntry(vBoxRanks,Entry,iRank);
  }
  return;
}

Assistant:

void Acec_ManCollectBoxSets_rec( Gia_Man_t * p, int Carry, int iRank, Vec_Int_t * vAdds, Vec_Int_t * vCarryMap, Vec_Int_t * vBoxes, Vec_Int_t * vBoxRanks )
{
    int iBox = Vec_IntEntry( vCarryMap, Carry );
    if ( iBox == -1 )
        return;
    Acec_ManCollectBoxSets_rec( p, Vec_IntEntry(vAdds, 6*iBox+0), iRank+1, vAdds, vCarryMap, vBoxes, vBoxRanks );
    Acec_ManCollectBoxSets_rec( p, Vec_IntEntry(vAdds, 6*iBox+1), iRank+1, vAdds, vCarryMap, vBoxes, vBoxRanks );
    if ( Vec_IntEntry(vAdds, 6*iBox+2) )
        Acec_ManCollectBoxSets_rec( p, Vec_IntEntry(vAdds, 6*iBox+2), iRank+1, vAdds, vCarryMap, vBoxes, vBoxRanks );
    Vec_IntPush( vBoxes, iBox );
    Vec_IntWriteEntry( vBoxRanks, iBox, iRank );
}